

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<long,_10> * __thiscall
TPZManVector<long,_10>::operator=(TPZManVector<long,_10> *this,initializer_list<long> *list)

{
  ulong uVar1;
  size_type sVar2;
  iterator plVar3;
  long *plVar4;
  long lVar5;
  
  uVar1 = list->_M_len;
  if (((ulong)(this->super_TPZVec<long>).fNAlloc < uVar1) &&
     (plVar4 = (this->super_TPZVec<long>).fStore, plVar4 != this->fExtAlloc && plVar4 != (long *)0x0
     )) {
    operator_delete__(plVar4);
    (this->super_TPZVec<long>).fStore = (long *)0x0;
    (this->super_TPZVec<long>).fNAlloc = 0;
  }
  if (uVar1 < 0xb) {
    plVar4 = (this->super_TPZVec<long>).fStore;
    if (plVar4 != (long *)0x0 && plVar4 != this->fExtAlloc) {
      operator_delete__(plVar4);
    }
    (this->super_TPZVec<long>).fNAlloc = 0;
    (this->super_TPZVec<long>).fStore = this->fExtAlloc;
  }
  else if ((ulong)(this->super_TPZVec<long>).fNAlloc < uVar1) {
    plVar4 = (long *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    (this->super_TPZVec<long>).fStore = plVar4;
    (this->super_TPZVec<long>).fNAlloc = uVar1;
  }
  (this->super_TPZVec<long>).fNElements = uVar1;
  sVar2 = list->_M_len;
  if (sVar2 != 0) {
    plVar3 = list->_M_array;
    plVar4 = (this->super_TPZVec<long>).fStore;
    lVar5 = 0;
    do {
      *(undefined8 *)((long)plVar4 + lVar5) = *(undefined8 *)((long)plVar3 + lVar5);
      lVar5 = lVar5 + 8;
    } while (sVar2 << 3 != lVar5);
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const std::initializer_list<T>& list) {
	size_t size = list.size();

	if (size > this->fNAlloc && this->fStore && this->fStore != this->fExtAlloc) {
		delete[] this->fStore;
		this->fStore = 0;
		this->fNAlloc = 0;
	}

	if (size <= NumExtAlloc) {
		if (this->fStore != fExtAlloc) {
			delete[]this->fStore;
		}
		this->fNAlloc = 0;
		this->fStore = fExtAlloc;
		this->fNElements = size;
	}
	else if (this->fNAlloc >= size) {
		this->fNElements = size;
	}
	else {
		this->fStore = new T[size];
		this->fNAlloc = size;
		this->fNElements = size;
	}

	auto it_end = list.end();
	T* aux = this->fStore;
	for (auto it = list.begin(); it != it_end; it++, aux++)
		*aux = *it;

	return *this;
}